

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think.c
# Opt level: O3

_Bool borg_save_game(void)

{
  errr eVar1;
  
  borg_keypress(0xe000);
  borg_keypress(0xe000);
  borg_keypress(0x5e);
  borg_keypress(0x53);
  borg_keypress(0xe000);
  eVar1 = borg_keypress(0xe000);
  return SUB41(eVar1,0);
}

Assistant:

static bool borg_save_game(void)
{
    /* Cancel everything */
    borg_keypress(ESCAPE);
    borg_keypress(ESCAPE);

    /* Save the game */
    borg_keypress('^');
    borg_keypress('S');

    /* Cancel everything */
    borg_keypress(ESCAPE);
    borg_keypress(ESCAPE);

    /* Success */
    return true;
}